

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O3

int Saig_ManExtendOneEval(Vec_Ptr_t *vSimInfo,Aig_Obj_t *pObj,int iFrame)

{
  uint *puVar1;
  int iVar2;
  void **ppvVar3;
  uint uVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  
  iVar2 = *(int *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24);
  if ((-1 < (long)iVar2) && (uVar9 = vSimInfo->nSize, iVar2 < (int)uVar9)) {
    ppvVar3 = vSimInfo->pArray;
    lVar7 = (long)(iFrame >> 4);
    bVar5 = (char)iFrame * '\x02' & 0x1e;
    uVar8 = *(uint *)((long)ppvVar3[iVar2] + lVar7 * 4) >> bVar5 & 3;
    uVar4 = 2;
    if (uVar8 != 1) {
      uVar4 = (uint)(uVar8 != 2) * 2 + 1;
    }
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      uVar4 = uVar8;
    }
    uVar8 = (uint)*(undefined8 *)&pObj->field_0x18;
    if ((uVar8 & 7) == 3) {
      lVar6 = (long)pObj->Id;
      if ((-1 < lVar6) && ((uint)pObj->Id < uVar9)) {
        if (uVar4 == 0) {
          __assert_fail("Value >= SAIG_ZER && Value <= SAIG_UND",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSim.c"
                        ,0x3d,"void Saig_ManSimInfoSet(Vec_Ptr_t *, Aig_Obj_t *, int, int)");
        }
LAB_0059784d:
        puVar1 = (uint *)((long)ppvVar3[lVar6] + lVar7 * 4);
        uVar9 = *puVar1;
        *puVar1 = (uVar9 >> bVar5 & 3 ^ uVar4) << bVar5 ^ uVar9;
        return uVar4;
      }
    }
    else {
      if ((uVar8 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSim.c"
                      ,0x9a,"int Saig_ManExtendOneEval(Vec_Ptr_t *, Aig_Obj_t *, int)");
      }
      uVar8 = *(uint *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x24);
      if ((-1 < (long)(int)uVar8) && (uVar8 < uVar9)) {
        lVar6 = (long)pObj->Id;
        if ((-1 < lVar6) && ((uint)pObj->Id < uVar9)) {
          uVar8 = *(uint *)((long)ppvVar3[(int)uVar8] + lVar7 * 4) >> bVar5 & 3;
          uVar9 = 2;
          if (uVar8 != 1) {
            uVar9 = (uVar8 != 2) + 1 + (uint)(uVar8 != 2);
          }
          if (((ulong)pObj->pFanin1 & 1) == 0) {
            uVar9 = uVar8;
          }
          uVar8 = (uVar9 == 2 && uVar4 == 2) ^ 3;
          if (uVar9 == 1) {
            uVar8 = 1;
          }
          if (uVar4 != 1) {
            uVar4 = uVar8;
          }
          goto LAB_0059784d;
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_ManExtendOneEval( Vec_Ptr_t * vSimInfo, Aig_Obj_t * pObj, int iFrame )
{
    int Value0, Value1, Value;
    Value0 = Saig_ManSimInfoGet( vSimInfo, Aig_ObjFanin0(pObj), iFrame );
    if ( Aig_ObjFaninC0(pObj) )
        Value0 = Saig_ManSimInfoNot( Value0 );
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManSimInfoSet( vSimInfo, pObj, iFrame, Value0 );
        return Value0;
    }
    assert( Aig_ObjIsNode(pObj) );
    Value1 = Saig_ManSimInfoGet( vSimInfo, Aig_ObjFanin1(pObj), iFrame );
    if ( Aig_ObjFaninC1(pObj) )
        Value1 = Saig_ManSimInfoNot( Value1 );
    Value = Saig_ManSimInfoAnd( Value0, Value1 );
    Saig_ManSimInfoSet( vSimInfo, pObj, iFrame, Value );
    return Value;
}